

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O1

void opengv::absolute_pose::modules::gpnp3::sPolynomial5
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
          m_storage.m_data.array[0x79];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).
          m_storage.m_data.array[0x7a];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x8c] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x88] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x89] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x9b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x97] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x98] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xaa] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xa6] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xa7] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xb9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xb5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xb6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[200] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xc4] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xc5] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xd7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xd3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xd4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xe6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xe2] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xe3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0xf5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xf1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0xf2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
  m_data.array[0x104] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x100] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>_>).m_storage.
       m_data.array[0x101] / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::sPolynomial5( Eigen::Matrix<double,15,18> & groebnerMatrix )
{
  groebnerMatrix(5,9) = (groebnerMatrix(1,9)/(groebnerMatrix(1,8))-groebnerMatrix(2,9)/(groebnerMatrix(2,8)));
  groebnerMatrix(5,10) = (groebnerMatrix(1,10)/(groebnerMatrix(1,8))-groebnerMatrix(2,10)/(groebnerMatrix(2,8)));
  groebnerMatrix(5,11) = (groebnerMatrix(1,11)/(groebnerMatrix(1,8))-groebnerMatrix(2,11)/(groebnerMatrix(2,8)));
  groebnerMatrix(5,12) = (groebnerMatrix(1,12)/(groebnerMatrix(1,8))-groebnerMatrix(2,12)/(groebnerMatrix(2,8)));
  groebnerMatrix(5,13) = (groebnerMatrix(1,13)/(groebnerMatrix(1,8))-groebnerMatrix(2,13)/(groebnerMatrix(2,8)));
  groebnerMatrix(5,14) = (groebnerMatrix(1,14)/(groebnerMatrix(1,8))-groebnerMatrix(2,14)/(groebnerMatrix(2,8)));
  groebnerMatrix(5,15) = (groebnerMatrix(1,15)/(groebnerMatrix(1,8))-groebnerMatrix(2,15)/(groebnerMatrix(2,8)));
  groebnerMatrix(5,16) = (groebnerMatrix(1,16)/(groebnerMatrix(1,8))-groebnerMatrix(2,16)/(groebnerMatrix(2,8)));
  groebnerMatrix(5,17) = (groebnerMatrix(1,17)/(groebnerMatrix(1,8))-groebnerMatrix(2,17)/(groebnerMatrix(2,8)));
}